

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

GLenum switch_rasterizer_with_mode
                 (bov_window_t *window,bov_points_t *points,bov_points_drawing_mode_t mode)

{
  uint uVar1;
  GLenum GVar2;
  
  if (mode < (FAST_TRIANGLE_FAN_PROGRAM|LINES_PROGRAM)) {
    uVar1 = *(uint *)(&DAT_00181eb0 + (ulong)mode * 4);
    GVar2 = *(GLenum *)(&DAT_00181eec + (ulong)mode * 4);
    if (window->last_program != uVar1) {
      (*glad_glUseProgram)(window->program[uVar1]);
      window->last_program = uVar1;
    }
    (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
    (*glad_glBufferSubData)(0x8a11,0,0x40,&points->param);
    (*glad_glBindVertexArray)(points->vao);
    return GVar2;
  }
  bov_error_log(0x20001,"this function is private but was given erroneous arguments anyway");
  fprintf(_stderr,"\t(in function %s, line %d)\n","switch_rasterizer_with_mode",0x5c4);
  exit(1);
}

Assistant:

static GLenum switch_rasterizer_with_mode(bov_window_t* window,
                                          const bov_points_t* points,
                                          bov_points_drawing_mode_t mode)
{
	int program_index;
	GLenum primitive = 0;

	switch(mode) {
		case POINTS_PROGRAM:
			program_index = POINTS_PROGRAM_INDEX;
			primitive = GL_POINTS;
			break;
		case LINES_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINES;
			break;
		case LINE_LOOP_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINE_LOOP;
			break;
		case LINE_STRIP_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP;
			break;
		case CURVE_PROGRAM:
			program_index = CURVE_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP_ADJACENCY;
			break;
		case TRIANGLES_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLES;
			break;
		case TRIANGLE_STRIP_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_STRIP;
			break;
		case TRIANGLE_FAN_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_FAN;
			break;
		// case QUADS_PROGRAM:
		// 	program_index = QUAD_PROGRAM_INDEX;
		// 	primitive = GL_LINES_ADJACENCY;
		// 	break;
		case FAST_POINTS_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_POINTS;
			break;
		case FAST_LINES_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINES;
			break;
		case FAST_LINE_LOOP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINE_LOOP;
			break;
		case FAST_LINE_STRIP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP;
			break;
		case FAST_TRIANGLES_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLES;
			break;
		case FAST_TRIANGLE_STRIP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_STRIP;
			break;
		case FAST_TRIANGLE_FAN_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_FAN;
			break;
		default:
			BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
			              "this function is private but was "
			              "given erroneous arguments anyway");
			exit(EXIT_FAILURE);
	}

	if(window->last_program!=program_index) {
		glUseProgram(window->program[program_index]);
		window->last_program = program_index;
	}

	// update the object ubo
	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[1]);
	glBufferSubData(GL_UNIFORM_BUFFER,
	                0,
	                sizeof(bov_points_param_t),
	                &points->param);
	// glBindBuffer(GL_UNIFORM_BUFFER, 0);

	glBindVertexArray(points->vao);

	return primitive;
}